

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.c
# Opt level: O1

Class * newRawClass(VM *vm,char *name,uint32_t fieldNum)

{
  Class *objHeader;
  size_t sVar1;
  ObjString *pOVar2;
  
  objHeader = (Class *)memManager(vm,(void *)0x0,0,0x40);
  initObjHeader(vm,(ObjHeader *)objHeader,OT_CLASS,(Class *)0x0);
  sVar1 = strlen(name);
  pOVar2 = newObjString(vm,name,(uint32_t)sVar1);
  objHeader->name = pOVar2;
  objHeader->fieldNum = fieldNum;
  objHeader->superClass = (class *)0x0;
  (objHeader->methods).datas = (Method *)0x0;
  (objHeader->methods).count = 0;
  (objHeader->methods).capacity = 0;
  return objHeader;
}

Assistant:

Class *newRawClass(VM *vm, const char *name, uint32_t fieldNum) {
    Class *class = ALLOCATE(vm, Class);
    initObjHeader(vm, &class->objHeader, OT_CLASS, NULL);
    class->name = newObjString(vm, name, strlen(name));
    class->fieldNum = fieldNum;
    class->superClass = NULL;
    MethodBufferInit(&class->methods);

    return class;
}